

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

void Wlc_NtkToNdrTest(Wlc_Ntk_t *pNtk)

{
  uint *puVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  int iVar4;
  uint uVar5;
  Ndr_Data_t *p_00;
  char **pNames;
  char *pcVar6;
  void *__ptr;
  char *pcVar7;
  int *piVar8;
  char *pcVar9;
  int Type;
  int Type_00;
  int Type_01;
  Ndr_Data_t *p;
  char *__format;
  ulong uVar10;
  int iVar11;
  int i;
  int iVar12;
  uint uVar13;
  long lVar14;
  int *local_48;
  long local_40;
  ulong local_38;
  
  p_00 = (Ndr_Data_t *)Wlc_NtkToNdr(pNtk);
  uVar10 = (ulong)pNtk->iObj;
  pNames = (char **)malloc(uVar10 << 3);
  for (lVar14 = 1; __stream = _stdout, lVar14 < (int)uVar10; lVar14 = lVar14 + 1) {
    Wlc_NtkObj(pNtk,(int)lVar14);
    pcVar6 = Wlc_ObjName(pNtk,(int)lVar14);
    pNames[lVar14] = pcVar6;
    uVar10 = (ulong)(uint)pNtk->iObj;
  }
  if (_stdout == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",0);
  }
  else {
    puVar1 = p_00->pBody;
    for (uVar10 = 1; iVar11 = (int)uVar10, iVar11 < (int)*puVar1;
        uVar10 = (ulong)(uint)(iVar11 + (int)uVar10)) {
      iVar3 = Ndr_DataType(p_00,iVar11);
      if (iVar3 == 2) {
        local_40 = (long)iVar11;
        iVar12 = 0;
        i = iVar11 + 1;
        for (iVar3 = i; iVar3 < (int)(puVar1[local_40] + iVar11); iVar3 = iVar3 + iVar4) {
          iVar4 = Ndr_DataType(p_00,iVar3);
          if (iVar4 == 3) {
            iVar4 = Ndr_ObjIsType(p_00,iVar3,4);
            iVar12 = (iVar12 + 1) - (uint)(iVar4 == 0);
          }
          iVar4 = Ndr_DataSize(p_00,iVar3);
        }
        __ptr = malloc((long)iVar12 << 2);
        iVar3 = Ndr_ObjReadEntry(p_00,iVar11,Type);
        fprintf(__stream,"\nmodule %s (\n  ",pNames[iVar3]);
        for (iVar3 = i; iVar3 < (int)(puVar1[local_40] + iVar11); iVar3 = iVar3 + iVar12) {
          iVar12 = Ndr_DataType(p_00,iVar3);
          if ((iVar12 == 3) && (iVar12 = Ndr_ObjIsType(p_00,iVar3,3), iVar12 != 0)) {
            pcVar6 = Ndr_ObjReadOutName(p_00,iVar3,pNames);
            fprintf(__stream,"%s, ",pcVar6);
          }
          iVar12 = Ndr_DataSize(p_00,iVar3);
        }
        fwrite("\n  ",3,1,__stream);
        bVar2 = true;
        for (iVar3 = i; iVar3 < (int)(puVar1[local_40] + iVar11); iVar3 = iVar3 + iVar12) {
          iVar12 = Ndr_DataType(p_00,iVar3);
          if ((iVar12 == 3) && (iVar12 = Ndr_ObjIsType(p_00,iVar3,4), iVar12 != 0)) {
            pcVar6 = "T = %d\t\t";
            if (!bVar2) {
              pcVar6 = "    \"%s\", ";
            }
            pcVar7 = Ndr_ObjReadInName(p_00,iVar3,pNames);
            bVar2 = false;
            fprintf(__stream,"%s%s",pcVar6 + 8,pcVar7);
          }
          iVar12 = Ndr_DataSize(p_00,iVar3);
        }
        fwrite("\n);\n\n",5,1,__stream);
        for (iVar3 = i; uVar5 = puVar1[local_40], iVar3 < (int)(uVar5 + iVar11);
            iVar3 = iVar3 + iVar12) {
          iVar12 = Ndr_DataType(p_00,iVar3);
          if ((iVar12 == 3) && (iVar12 = Ndr_ObjIsType(p_00,iVar3,3), iVar12 != 0)) {
            fwrite("  input ",8,1,__stream);
            Ndr_ObjWriteRange(p_00,iVar3,(FILE *)__stream,1);
            pcVar6 = Ndr_ObjReadOutName(p_00,iVar3,pNames);
            fprintf(__stream," %s;\n",pcVar6);
          }
          iVar12 = Ndr_DataSize(p_00,iVar3);
        }
        uVar13 = 0;
        local_38 = uVar10;
        for (iVar11 = i; iVar11 < (int)(uVar5 + (int)local_38); iVar11 = iVar11 + iVar3) {
          iVar3 = Ndr_DataType(p_00,iVar11);
          if ((iVar3 == 3) && (iVar3 = Ndr_ObjIsType(p_00,iVar11,4), iVar3 != 0)) {
            fwrite("  output ",9,1,__stream);
            Ndr_ObjWriteRange(p_00,iVar11,(FILE *)__stream,1);
            pcVar6 = Ndr_ObjReadInName(p_00,iVar11,pNames);
            fprintf(__stream," %s;\n",pcVar6);
            iVar3 = Ndr_ObjReadBody(p_00,iVar11,4);
            lVar14 = (long)(int)uVar13;
            uVar13 = uVar13 + 1;
            *(int *)((long)__ptr + lVar14 * 4) = iVar3;
          }
          iVar3 = Ndr_DataSize(p_00,iVar11);
          uVar5 = puVar1[local_40];
        }
        fputc(10,__stream);
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (iVar11 = i; iVar11 < (int)(puVar1[local_40] + (int)local_38); iVar11 = iVar11 + iVar3)
        {
          iVar3 = Ndr_DataType(p_00,iVar11);
          if (((iVar3 == 3) && (iVar3 = Ndr_ObjIsType(p_00,iVar11,3), iVar3 == 0)) &&
             (iVar3 = Ndr_ObjIsType(p_00,iVar11,4), iVar3 == 0)) {
            uVar10 = 0;
            do {
              if (uVar13 == uVar10) {
                fwrite("  wire ",7,1,__stream);
                Ndr_ObjWriteRange(p_00,iVar11,(FILE *)__stream,1);
                pcVar6 = Ndr_ObjReadOutName(p_00,iVar11,pNames);
                fprintf(__stream," %s;\n",pcVar6);
                break;
              }
              iVar3 = *(int *)((long)__ptr + uVar10 * 4);
              iVar12 = Ndr_ObjReadBody(p_00,iVar11,5);
              uVar10 = uVar10 + 1;
            } while (iVar3 != iVar12);
          }
          iVar3 = Ndr_DataSize(p_00,iVar11);
        }
        free(__ptr);
        fputc(10,__stream);
        uVar10 = local_38;
        for (; i < (int)(puVar1[local_40] + (int)uVar10); i = i + iVar11) {
          iVar11 = Ndr_DataType(p_00,i);
          if (((iVar11 != 3) || (iVar11 = Ndr_ObjIsType(p_00,i,3), iVar11 != 0)) ||
             (iVar11 = Ndr_ObjIsType(p_00,i,4), iVar11 != 0)) goto LAB_00305ec9;
          iVar11 = Ndr_ObjReadBody(p_00,i,6);
          if (0xff < iVar11) {
            iVar11 = Ndr_ObjReadEntry(p_00,iVar11 + -0x100,Type_00);
            fprintf(__stream,"  %s ",pNames[iVar11]);
            iVar11 = Ndr_ObjReadBody(p_00,i,7);
            if (0 < iVar11) {
              iVar11 = Ndr_ObjReadBody(p_00,i,7);
              fprintf(__stream,"%s ",pNames[iVar11]);
            }
            fwrite("( ",2,1,__stream);
            uVar13 = Ndr_ObjReadArray(p_00,i,4,&local_48);
            piVar8 = local_48;
            uVar5 = uVar13;
            if ((int)uVar13 < 1) {
              uVar5 = 0;
            }
            for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
              pcVar6 = ",";
              if (uVar13 - 1 == uVar10) {
                pcVar6 = "";
              }
              fprintf(__stream,"%s%s ",pNames[piVar8[uVar10]],pcVar6);
            }
            pcVar6 = ");\n";
LAB_00305b0d:
            fwrite(pcVar6,3,1,__stream);
            uVar10 = local_38;
            goto LAB_00305ec9;
          }
          switch(iVar11) {
          case 0x50:
            fprintf(__stream,"  %s ","ABC_READ");
            iVar11 = Ndr_ObjReadBody(p_00,i,7);
            if (0 < iVar11) {
              iVar11 = Ndr_ObjReadBody(p_00,i,7);
              fprintf(__stream,"%s ",pNames[iVar11]);
            }
            fwrite("( ",2,1,__stream);
            Ndr_ObjReadArray(p_00,i,4,&local_48);
            pcVar6 = Ndr_ObjReadOutName(p_00,i,pNames);
            fprintf(__stream,".data(%s), ",pcVar6);
            piVar8 = local_48;
            fprintf(__stream,".mem_in(%s), ",pNames[*local_48]);
            pcVar6 = pNames[piVar8[1]];
            pcVar7 = ".addr(%s) ";
            break;
          case 0x51:
            fprintf(__stream,"  %s ","ABC_WRITE");
            iVar11 = Ndr_ObjReadBody(p_00,i,7);
            if (0 < iVar11) {
              iVar11 = Ndr_ObjReadBody(p_00,i,7);
              fprintf(__stream,"%s ",pNames[iVar11]);
            }
            fwrite("( ",2,1,__stream);
            Ndr_ObjReadArray(p_00,i,4,&local_48);
            pcVar6 = Ndr_ObjReadOutName(p_00,i,pNames);
            fprintf(__stream,".mem_out(%s), ",pcVar6);
            piVar8 = local_48;
            fprintf(__stream,".mem_in(%s), ",pNames[*local_48]);
            fprintf(__stream,".addr(%s), ",pNames[piVar8[1]]);
            pcVar6 = pNames[piVar8[2]];
            pcVar7 = ".data(%s) ";
            break;
          default:
            pcVar6 = Ndr_ObjReadOutName(p_00,i,pNames);
            fprintf(__stream,"  assign %s = ",pcVar6);
            uVar5 = Ndr_ObjReadArray(p_00,i,4,&local_48);
            if (uVar5 == 0) {
              piVar8 = Ndr_ObjReadBodyP(p_00,i,Type_01);
LAB_00305fb8:
              fprintf(__stream,"%s;\n",piVar8);
            }
            else {
              if ((uVar5 == 1) && (iVar3 = Ndr_ObjReadBody(p_00,i,6), iVar3 == 0xb)) {
                piVar8 = (int *)pNames[*local_48];
                goto LAB_00305fb8;
              }
              piVar8 = local_48;
              if (iVar11 == 0x5c) {
                fputc(0x7b,__stream);
                piVar8 = local_48;
                uVar13 = uVar5;
                if ((int)uVar5 < 1) {
                  uVar13 = 0;
                }
                for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                  pcVar6 = "    \"%s\", ";
                  if (uVar5 - 1 == uVar10) {
                    pcVar6 = "T = %d\t\t";
                  }
                  fprintf(__stream,"%s%s",pNames[piVar8[uVar10]],pcVar6 + 8);
                }
                pcVar6 = "};\n";
                goto LAB_00305b0d;
              }
              if (iVar11 == 0x5b) {
                fputs(pNames[*local_48],__stream);
                Ndr_ObjWriteRange(p_00,i,(FILE *)__stream,0);
                fwrite(";\n",2,1,__stream);
              }
              else if (uVar5 == 1) {
                iVar11 = Ndr_ObjReadBody(p_00,i,6);
                pcVar6 = Abc_OperName(iVar11);
                fprintf(__stream,"%s %s;\n",pcVar6,pNames[*local_48]);
              }
              else {
                if (uVar5 == 2) {
                  pcVar6 = pNames[*local_48];
                  iVar11 = Ndr_ObjReadBody(p_00,i,6);
                  pcVar9 = Abc_OperName(iVar11);
                  pcVar7 = pNames[piVar8[1]];
                  __format = "%s %s %s;\n";
                }
                else {
                  if (iVar11 != 0x32 || uVar5 != 3) {
                    if (iVar11 == 0x15) {
                      fprintf(__stream,"%s ? %s : %s;\n",pNames[*local_48],pNames[local_48[1]],
                              pNames[local_48[2]]);
                    }
                    else {
                      iVar11 = Ndr_ObjReadBody(p_00,i,6);
                      pcVar6 = Abc_OperName(iVar11);
                      fprintf(__stream,"<cannot write operation %s>;\n",pcVar6);
                    }
                    goto LAB_00305ec9;
                  }
                  pcVar6 = pNames[*local_48];
                  pcVar9 = pNames[local_48[1]];
                  pcVar7 = pNames[local_48[2]];
                  __format = "%s + %s + %s;\n";
                }
                fprintf(__stream,__format,pcVar6,pcVar9,pcVar7);
              }
            }
            goto LAB_00305ec9;
          case 0x58:
            fprintf(__stream,"  %s ","ABC_DFF");
            iVar11 = Ndr_ObjReadBody(p_00,i,7);
            if (0 < iVar11) {
              iVar11 = Ndr_ObjReadBody(p_00,i,7);
              fprintf(__stream,"%s ",pNames[iVar11]);
            }
            fwrite("( ",2,1,__stream);
            Ndr_ObjReadArray(p_00,i,4,&local_48);
            pcVar6 = Ndr_ObjReadOutName(p_00,i,pNames);
            fprintf(__stream,".q(%s), ",pcVar6);
            piVar8 = local_48;
            fprintf(__stream,".d(%s), ",pNames[*local_48]);
            pcVar6 = pNames[piVar8[1]];
            goto LAB_00305e9e;
          case 0x59:
            fprintf(__stream,"  %s ","ABC_DFFRSE");
            iVar11 = Ndr_ObjReadBody(p_00,i,7);
            if (0 < iVar11) {
              iVar11 = Ndr_ObjReadBody(p_00,i,7);
              fprintf(__stream,"%s ",pNames[iVar11]);
            }
            fwrite("( ",2,1,__stream);
            Ndr_ObjReadArray(p_00,i,4,&local_48);
            pcVar6 = Ndr_ObjReadOutName(p_00,i,pNames);
            fprintf(__stream,".q(%s), ",pcVar6);
            piVar8 = local_48;
            fprintf(__stream,".d(%s), ",pNames[*local_48]);
            fprintf(__stream,".clk(%s), ",pNames[piVar8[1]]);
            fprintf(__stream,".reset(%s), ",pNames[piVar8[2]]);
            fprintf(__stream,".set(%s), ",pNames[piVar8[3]]);
            fprintf(__stream,".enable(%s), ",pNames[piVar8[4]]);
            fprintf(__stream,".async(%s), ",pNames[piVar8[5]]);
            fprintf(__stream,".sre(%s), ",pNames[piVar8[6]]);
            pcVar6 = pNames[piVar8[7]];
LAB_00305e9e:
            pcVar7 = ".init(%s) ";
          }
          fprintf(__stream,pcVar7,pcVar6);
          fwrite(");\n",3,1,__stream);
LAB_00305ec9:
          iVar11 = Ndr_DataSize(p_00,i);
        }
        fwrite("\nendmodule\n\n",0xc,1,__stream);
      }
      iVar11 = Ndr_DataSize(p_00,(int)uVar10);
    }
  }
  Ndr_Write("test.ndr",p_00);
  Ndr_Delete(p_00);
  free(pNames);
  return;
}

Assistant:

void Wlc_NtkToNdrTest( Wlc_Ntk_t * pNtk )
{
    // transform
    void * pDesign = Wlc_NtkToNdr( pNtk );

    // collect names     
    Wlc_Obj_t * pObj;  int i;
    char ** ppNames = ABC_ALLOC( char *, Wlc_NtkObjNum(pNtk) + 1 );
    Wlc_NtkForEachObj( pNtk, pObj, i ) 
        ppNames[i] = Wlc_ObjName(pNtk, i);

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    ABC_FREE( ppNames );
}